

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_true,_false>::unfix_
          (DaTrie<false,_true,_false> *this,uint32_t node_pos,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  uint32_t uVar1;
  uint uVar2;
  reference this_00;
  reference pvVar3;
  uint uVar4;
  vector<ddd::Block,_std::allocator<ddd::Block>_> *in_RDX;
  uint in_ESI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t block_pos;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar4 = in_ESI >> 8;
  if (*(int *)((long)&in_RDI[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                      super__Vector_impl_data._M_start + 4) == 0) {
    set_next_((DaTrie<false,_true,_false> *)
              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    set_prev_((DaTrie<false,_true,_false> *)
              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    *(uint *)&in_RDI[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
              super__Vector_impl_data._M_start = in_ESI;
  }
  else {
    uVar2 = in_ESI;
    prev_((DaTrie<false,_true,_false> *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
          in_stack_ffffffffffffffcc);
    set_prev_((DaTrie<false,_true,_false> *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    set_next_((DaTrie<false,_true,_false> *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    prev_((DaTrie<false,_true,_false> *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
          in_stack_ffffffffffffffcc);
    set_next_((DaTrie<false,_true,_false> *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    set_prev_((DaTrie<false,_true,_false> *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  }
  this_00 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
  Bc::unfix(this_00);
  *(int *)((long)&in_RDI[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                  super__Vector_impl_data._M_start + 4) =
       *(int *)((long)&in_RDI[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) + 1;
  pvVar3 = std::vector<ddd::Block,_std::allocator<ddd::Block>_>::operator[](in_RDX,(ulong)uVar4);
  pvVar3->num_emps = pvVar3->num_emps + 1;
  uVar2 = uVar4;
  uVar1 = num_blocks((DaTrie<false,_true,_false> *)0x15c372);
  if (uVar4 == uVar1 - 1) {
    while (pvVar3 = std::vector<ddd::Block,_std::allocator<ddd::Block>_>::operator[]
                              (in_RDX,(ulong)uVar2), pvVar3->num_emps == 0x100) {
      pop_block_((DaTrie<false,_true,_false> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
      uVar1 = num_blocks((DaTrie<false,_true,_false> *)0x15c3ad);
      if (uVar1 == 0) {
        return;
      }
      uVar2 = uVar2 - 1;
    }
  }
  return;
}

Assistant:

void unfix_(uint32_t node_pos, std::vector<Block>& blocks) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());

    auto block_pos = node_pos / BLOCK_SIZE;

    if (bc_emps_ == 0) {
      set_next_(node_pos, node_pos);
      set_prev_(node_pos, node_pos);
      head_pos_ = node_pos;
    } else {
      set_prev_(node_pos, prev_(head_pos_));
      set_next_(node_pos, head_pos_);
      set_next_(prev_(head_pos_), node_pos);
      set_prev_(head_pos_, node_pos);
    }

    bc_[node_pos].unfix();

    ++bc_emps_;
    ++blocks[block_pos].num_emps;

    if (block_pos == num_blocks() - 1) {
      while (blocks[block_pos].num_emps == BLOCK_SIZE) {
        pop_block_();
        if (num_blocks() == 0) {
          break;
        }
        --block_pos;
      }
    }
  }